

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# revp.c
# Opt level: O0

EVevent_list copy_EVevent_list(EVevent_list list)

{
  int iVar1;
  EVevent_list size_00;
  void *pvVar2;
  EVevent_list in_RDI;
  int size;
  int i;
  EVevent_list ret;
  int local_14;
  size_t in_stack_fffffffffffffff0;
  
  iVar1 = count_EVevent_list(in_RDI);
  size_00 = (EVevent_list)INT_CMmalloc(in_stack_fffffffffffffff0);
  for (local_14 = 0; local_14 < iVar1 + -1; local_14 = local_14 + 1) {
    size_00[local_14].length = in_RDI[local_14].length;
    pvVar2 = INT_CMmalloc((size_t)size_00);
    size_00[local_14].buffer = pvVar2;
    memcpy(size_00[local_14].buffer,in_RDI[local_14].buffer,in_RDI[local_14].length);
  }
  size_00[local_14].length = 0;
  size_00[local_14].buffer = (void *)0x0;
  return size_00;
}

Assistant:

EVevent_list
copy_EVevent_list(EVevent_list list)
{
    EVevent_list ret;
    int i, size = count_EVevent_list(list);
    ret = (EVevent_list) malloc(sizeof(ret[0]) * size);
    for (i=0; i < size-1; i++) {
        ret[i].length = list[i].length;
        ret[i].buffer = malloc(list[i].length);
        memcpy(ret[i].buffer, list[i].buffer, list[i].length);
    }
    ret[i].length = 0;
    ret[i].buffer = NULL;
    return ret;
}